

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_tf_do_filtering_mt(AV1_COMP *cpi)

{
  ThreadData_conflict *__src;
  int iVar1;
  uint uVar2;
  EncWorkerData *pEVar3;
  long lVar4;
  AVxWorker *pAVar5;
  undefined1 *puVar6;
  int iVar7;
  void *pvVar8;
  AVxWorkerInterface *pAVar9;
  ulong uVar10;
  char *pcVar11;
  void **ppvVar12;
  int iVar13;
  long lVar14;
  ThreadData_conflict *__dest;
  AVxWorker *pAVar15;
  size_t size;
  uint uVar16;
  long lVar17;
  long lVar18;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  iVar1 = (cpi->tf_ctx).is_highbitdepth;
  uVar16 = (cpi->mt_info).num_mod_workers[1];
  uVar2 = (cpi->mt_info).num_workers;
  if ((int)uVar16 < (int)uVar2) {
    uVar2 = uVar16;
  }
  uVar10 = (ulong)uVar2;
  (cpi->mt_info).tf_sync.next_tf_row = 0;
  (cpi->mt_info).tf_sync.tf_mt_exit = false;
  if (0 < (int)uVar2) {
    __src = &cpi->td;
    lVar18 = uVar10 + 1;
    lVar14 = uVar10 * 0x1d0;
    lVar17 = uVar10 * 0x38;
    uVar16 = uVar2;
    do {
      uVar16 = uVar16 - 1;
      pAVar15 = (cpi->mt_info).workers;
      pEVar3 = (cpi->mt_info).tile_thr_data;
      pcVar11 = pEVar3[-1].error_info.detail + lVar14 + -0x20;
      *(code **)((long)pAVar15 + lVar17 + -0x20) = tf_worker_hook;
      *(char **)((long)pAVar15 + lVar17 + -0x18) = pcVar11;
      *(undefined8 *)((long)pAVar15 + lVar17 + -0x10) = 0;
      *(uint *)((pEVar3->error_info).detail + lVar14 + -0x24) = uVar16;
      *(uint *)((pEVar3->error_info).detail + lVar14 + -0x28) = uVar16;
      *(AV1_COMP **)pcVar11 = cpi;
      __dest = __src;
      if (lVar14 != 0x1d0) {
        __dest = *(ThreadData_conflict **)((long)pEVar3 + lVar14 + -0x1c0);
      }
      *(ThreadData_conflict **)((long)pEVar3 + lVar14 + -0x1c8) = __dest;
      if (__dest != __src) {
        memcpy(__dest,__src,0x256b0);
        av1_init_obmc_buffer((OBMCBuffer *)(*(long *)((long)pEVar3 + lVar14 + -0x1c8) + 0x41a0));
        lVar4 = *(long *)((long)pEVar3 + lVar14 + -0x1c8);
        iVar13 = (cpi->tf_ctx).num_pels;
        size = (size_t)iVar13;
        pvVar8 = aom_calloc(1,0xb0);
        *(void **)(lVar4 + 0x25da0) = pvVar8;
        pvVar8 = aom_memalign(0x10,size * 4);
        *(void **)(lVar4 + 0x25da8) = pvVar8;
        pvVar8 = aom_memalign(0x10,size * 2);
        *(void **)(lVar4 + 0x25db0) = pvVar8;
        if (iVar1 == 0) {
          pvVar8 = aom_memalign(0x20,size);
        }
        else {
          pvVar8 = aom_memalign(0x20,(long)(iVar13 * 2));
          pvVar8 = (void *)((ulong)pvVar8 >> 1);
        }
        *(void **)(lVar4 + 0x25db8) = pvVar8;
        if ((((*(long *)(lVar4 + 0x25da0) == 0) || (*(long *)(lVar4 + 0x25da8) == 0)) ||
            (*(long *)(lVar4 + 0x25db0) == 0)) || (*(long *)(lVar4 + 0x25db8) == 0)) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Error allocating temporal filter data");
        }
        else {
          *(undefined1 (*) [16])(lVar4 + 0x25d90) = (undefined1  [16])0x0;
        }
      }
      lVar18 = lVar18 + -1;
      lVar14 = lVar14 + -0x1d0;
      lVar17 = lVar17 + -0x38;
    } while (1 < lVar18);
  }
  pAVar9 = aom_get_worker_interface();
  if (0 < (int)uVar2) {
    lVar18 = uVar10 + 1;
    lVar14 = uVar10 * 0x38;
    do {
      pAVar15 = (cpi->mt_info).workers;
      *(undefined4 *)((long)&pAVar15[-1].had_error + lVar14) = 0;
      pAVar15 = (AVxWorker *)((long)&pAVar15[-1].impl_ + lVar14);
      if (lVar18 == 2) {
        (*pAVar9->execute)(pAVar15);
      }
      else {
        (*pAVar9->launch)(pAVar15);
      }
      lVar18 = lVar18 + -1;
      lVar14 = lVar14 + -0x38;
    } while (1 < lVar18);
  }
  pAVar9 = aom_get_worker_interface();
  pAVar15 = (cpi->mt_info).workers;
  iVar13 = pAVar15->had_error;
  if (iVar13 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar15->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar2) {
    lVar14 = uVar10 + 1;
    lVar18 = uVar10 * 0x38;
    do {
      pAVar5 = (cpi->mt_info).workers;
      iVar7 = (*pAVar9->sync)((AVxWorker *)((long)&pAVar5[-1].impl_ + lVar18));
      if (iVar7 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar5[-1].data1 + lVar18) + 0x18),0x1a0);
        iVar13 = 1;
      }
      lVar14 = lVar14 + -1;
      lVar18 = lVar18 + -0x38;
    } while (2 < lVar14);
  }
  if (iVar13 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar15->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar2) {
    lVar18 = uVar10 + 1;
    ppvVar12 = &(cpi->mt_info).workers[uVar10 - 1].data1;
    do {
      puVar6 = *(undefined1 **)((long)*ppvVar12 + 8);
      if ((ThreadData_conflict *)puVar6 != &cpi->td) {
        lVar14 = *(long *)(puVar6 + 0x25d98);
        lVar17 = (cpi->td).tf_data.diff.sse;
        (cpi->td).tf_data.diff.sum = (cpi->td).tf_data.diff.sum + *(long *)(puVar6 + 0x25d90);
        (cpi->td).tf_data.diff.sse = lVar17 + lVar14;
      }
      lVar18 = lVar18 + -1;
      ppvVar12 = ppvVar12 + -7;
    } while (1 < lVar18);
    if (0 < (int)uVar2) {
      lVar14 = uVar10 + 1;
      lVar18 = uVar10 * 0x1d0 + -0x1c8;
      do {
        puVar6 = *(undefined1 **)
                  ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar18 + -0x20);
        if ((ThreadData_conflict *)puVar6 != &cpi->td) {
          if (iVar1 != 0) {
            *(long *)(puVar6 + 0x25db8) = *(long *)(puVar6 + 0x25db8) << 1;
          }
          aom_free(*(void **)(puVar6 + 0x25da0));
          *(undefined8 *)(puVar6 + 0x25da0) = 0;
          aom_free(*(void **)(puVar6 + 0x25da8));
          *(undefined8 *)(puVar6 + 0x25da8) = 0;
          aom_free(*(void **)(puVar6 + 0x25db0));
          *(undefined8 *)(puVar6 + 0x25db0) = 0;
          aom_free(*(void **)(puVar6 + 0x25db8));
          *(undefined8 *)(puVar6 + 0x25db8) = 0;
        }
        lVar14 = lVar14 + -1;
        lVar18 = lVar18 + -0x1d0;
      } while (1 < lVar14);
    }
  }
  return;
}

Assistant:

void av1_tf_do_filtering_mt(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *mt_info = &cpi->mt_info;
  const int is_highbitdepth = cpi->tf_ctx.is_highbitdepth;

  int num_workers =
      AOMMIN(mt_info->num_mod_workers[MOD_TF], mt_info->num_workers);

  prepare_tf_workers(cpi, tf_worker_hook, num_workers, is_highbitdepth);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  tf_accumulate_frame_diff(cpi, num_workers);
  tf_dealloc_thread_data(cpi, num_workers, is_highbitdepth);
}